

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

void Opa_ManPerform(Gia_Man_t *pGia)

{
  int iVar1;
  Opa_Man_t *p_00;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  uint local_2c;
  int local_28;
  int Count;
  int Limit;
  int i;
  Gia_Obj_t *pObj;
  Opa_Man_t *p;
  Gia_Man_t *pGia_local;
  
  local_2c = 0;
  p_00 = Opa_ManStart(pGia);
  local_28 = Vec_IntSize(p_00->vFront);
  Count = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00->vFront);
    bVar3 = false;
    if (Count < iVar1) {
      iVar1 = Vec_IntEntry(p_00->vFront,Count);
      _Limit = Gia_ManObj(pGia,iVar1);
      bVar3 = _Limit != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    if (Count == local_28) {
      local_2c = local_2c + 1;
      printf("%6d : %6d -> %6d\n",(ulong)local_2c,(ulong)(uint)Count,(ulong)(uint)p_00->nParts);
      local_28 = Vec_IntSize(p_00->vFront);
      if (1 < (int)local_2c) {
        Opa_ManPrint2(p_00);
      }
    }
    iVar1 = Gia_ObjIsAnd(_Limit);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(_Limit);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                      ,0xc5,"void Opa_ManPerform(Gia_Man_t *)");
      }
      pGVar2 = Gia_ObjFanin0(_Limit);
      Opa_ManMoveOne(p_00,_Limit,pGVar2);
    }
    else {
      pGVar2 = Gia_ObjFanin0(_Limit);
      Opa_ManMoveOne(p_00,_Limit,pGVar2);
      pGVar2 = Gia_ObjFanin1(_Limit);
      Opa_ManMoveOne(p_00,_Limit,pGVar2);
    }
    if ((p_00->nParts == 1) || (local_2c == 5)) break;
    Count = Count + 1;
  }
  printf("\n");
  Opa_ManStop(p_00);
  return;
}

Assistant:

void Opa_ManPerform( Gia_Man_t * pGia )
{
    Opa_Man_t * p;
    Gia_Obj_t * pObj;
    int i, Limit, Count = 0;
 
    p = Opa_ManStart( pGia );
    Limit = Vec_IntSize(p->vFront);
//Opa_ManPrint2( p );
    Gia_ManForEachObjVec( p->vFront, pGia, pObj, i )
    {
        if ( i == Limit )
        {
            printf( "%6d : %6d -> %6d\n", ++Count, i, p->nParts );
            Limit = Vec_IntSize(p->vFront);
            if ( Count > 1 )
                Opa_ManPrint2( p );
        }
//        printf( "*** Object %d  ", Gia_ObjId(pGia, pObj) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin0(pObj) );
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin1(pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin0(pObj) );
        else assert( 0 );
//        if ( i % 10 == 0 )
//            printf( "%d   ", p->nParts );
        if ( p->nParts == 1 )
            break;
        if ( Count == 5 )
            break;
    }
    printf( "\n" );
    Opa_ManStop( p );
}